

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* phosg::split_args(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  runtime_error *prVar5;
  ulong uVar6;
  char cVar7;
  char __c;
  ulong uVar8;
  bool bVar9;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = s->_M_string_length;
  if (uVar6 != 0) {
    bVar2 = true;
    uVar8 = 0;
    cVar7 = '\0';
    do {
      pcVar1 = (s->_M_dataplus)._M_p;
      __c = pcVar1[uVar8];
      if (cVar7 == '\0') {
        bVar9 = true;
        cVar7 = __c;
        bVar3 = true;
        if ((__c == '\"') || (__c == '\'')) {
LAB_0010ec38:
          bVar9 = bVar3;
          __c = '\0';
        }
        else {
          if (__c == '\\') {
            uVar8 = uVar8 + 1;
            if (uVar6 <= uVar8) {
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error(prVar5,"incomplete escape sequence");
LAB_0010ed2e:
              __cxa_throw(prVar5,&::std::runtime_error::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            __c = pcVar1[uVar8];
            cVar7 = '\0';
            goto LAB_0010ec57;
          }
          cVar7 = '\0';
        }
      }
      else {
        if (__c == cVar7) {
          cVar7 = '\0';
          bVar3 = false;
          goto LAB_0010ec38;
        }
        if (__c == '\\') {
          uVar8 = uVar8 + 1;
          if (uVar6 <= uVar8) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar5,"incomplete escape sequence");
            goto LAB_0010ed2e;
          }
          __c = pcVar1[uVar8];
        }
LAB_0010ec57:
        bVar9 = false;
      }
      bVar3 = bVar2;
      if (__c != '\0') {
        if (bVar9) {
          iVar4 = isblank((int)__c);
          bVar9 = iVar4 != 0;
        }
        else {
          bVar9 = false;
        }
        if (bVar9) {
          if (!bVar2) {
            if (!bVar9) goto LAB_0010ec87;
LAB_0010ecae:
            bVar3 = true;
            if (bVar2) goto LAB_0010ecb6;
          }
        }
        else {
LAB_0010ec87:
          if (bVar2) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>(__return_storage_ptr__);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((__return_storage_ptr__->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish + -1,__c);
            bVar3 = false;
          }
          else {
            if (bVar9) goto LAB_0010ecae;
LAB_0010ecb6:
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((__return_storage_ptr__->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish + -1,__c);
            bVar3 = bVar2;
          }
        }
      }
      bVar2 = bVar3;
      uVar8 = uVar8 + 1;
      uVar6 = s->_M_string_length;
    } while (uVar8 < uVar6);
    if (cVar7 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar5,"unterminated quoted string");
      __cxa_throw(prVar5,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> split_args(const string& s) {
  vector<string> ret;
  char current_quote = 0;
  bool in_space_between_args = true;

  for (size_t z = 0; z < s.size(); z++) {
    bool can_be_space = true;
    char to_write = 0;
    if (current_quote) {
      can_be_space = false;
      if (s[z] == current_quote) {
        current_quote = 0;
      } else if (s[z] == '\\') {
        z++;
        if (z >= s.size()) {
          throw runtime_error("incomplete escape sequence");
        }
        to_write = s[z];
      } else {
        to_write = s[z];
      }
    } else if ((s[z] == '\"') || (s[z] == '\'')) {
      current_quote = s[z];
    } else if (s[z] == '\\') {
      can_be_space = false;
      z++;
      if (z >= s.size()) {
        throw runtime_error("incomplete escape sequence");
      }
      to_write = s[z];
    } else {
      to_write = s[z];
    }

    if (to_write) {
      bool is_space_between_args = can_be_space && isblank(to_write);
      if (is_space_between_args && in_space_between_args) {
        // Nothing
      } else if (!is_space_between_args && in_space_between_args) {
        // Start of another arg
        ret.emplace_back();
        if (to_write) {
          ret.back().push_back(to_write);
        }
        in_space_between_args = false;
      } else if (is_space_between_args && !in_space_between_args) {
        in_space_between_args = true;
      } else { // !is_space_between_args && !in_space_between_args
        ret.back().push_back(to_write);
      }
    }
  }

  if (current_quote) {
    throw runtime_error("unterminated quoted string");
  }

  return ret;
}